

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O1

float * FAudio_INTERNAL_ProcessEffectChain(FAudioVoice *voice,float *buffer,uint32_t *samples)

{
  FAudioEffectDescriptor *pFVar1;
  long lVar2;
  FAudio *pFVar3;
  float *pfVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  FAPOProcessBufferParameters srcParams;
  float *local_60;
  FAPOBufferFlags local_58;
  uint local_54;
  float *local_50;
  undefined4 local_48;
  uint local_44;
  uint *local_40;
  float *local_38;
  
  local_48 = 0;
  local_54 = *samples;
  if ((ulong)local_54 != 0) {
    uVar6 = 0;
    do {
      if ((buffer[uVar6] != 0.0) || (NAN(buffer[uVar6]))) {
        local_48 = 1;
        break;
      }
      uVar6 = uVar6 + 1;
    } while (local_54 != uVar6);
  }
  local_58 = FAPO_BUFFER_VALID;
  local_60 = buffer;
  local_40 = samples;
  if ((voice->effects).count != 0) {
    lVar7 = 0;
    uVar6 = 0;
    local_50 = buffer;
    local_44 = local_54;
    local_38 = buffer;
    do {
      pFVar1 = (voice->effects).desc;
      lVar2 = *(long *)((long)&pFVar1->pEffect + lVar7);
      if ((voice->effects).inPlaceProcessing[uVar6] == '\0') {
        pfVar4 = local_38;
        if (local_60 == local_38) {
          pFVar3 = voice->audio;
          uVar5 = local_44 * *(int *)((long)&pFVar1->OutputChannels + lVar7);
          if (pFVar3->effectChainSamples < uVar5) {
            pFVar3->effectChainSamples = uVar5;
            pfVar4 = (float *)(*pFVar3->pRealloc)(pFVar3->effectChainCache,(ulong)uVar5 << 2);
            pFVar3->effectChainCache = pfVar4;
          }
          pfVar4 = voice->audio->effectChainCache;
        }
        local_60 = pfVar4;
        SDL_memset(pfVar4,0,(ulong)(local_44 *
                                   *(int *)((long)&((voice->effects).desc)->OutputChannels + lVar7))
                            << 2);
      }
      if ((voice->effects).parameterUpdates[uVar6] != '\0') {
        (**(code **)(lVar2 + 0x60))
                  (lVar2,(voice->effects).parameters[uVar6],(voice->effects).parameterSizes[uVar6]);
        (voice->effects).parameterUpdates[uVar6] = '\0';
      }
      (**(code **)(lVar2 + 0x48))
                (lVar2,1,&local_50,1,&local_60,
                 *(undefined4 *)((long)&((voice->effects).desc)->InitialState + lVar7));
      SDL_memcpy(&local_50,&local_60,0x10);
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < (voice->effects).count);
  }
  *local_40 = local_54;
  (voice->effects).state = local_58;
  return local_60;
}

Assistant:

static inline float *FAudio_INTERNAL_ProcessEffectChain(
	FAudioVoice *voice,
	float *buffer,
	uint32_t *samples
) {
	uint32_t i;
	FAPO *fapo;
	FAPOProcessBufferParameters srcParams, dstParams;

	LOG_FUNC_ENTER(voice->audio)

	/* Set up the buffer to be written into */
	srcParams.pBuffer = buffer;
	srcParams.BufferFlags = FAPO_BUFFER_SILENT;
	srcParams.ValidFrameCount = *samples;
	for (i = 0; i < srcParams.ValidFrameCount; i += 1)
	{
		if (buffer[i] != 0.0f) /* Arbitrary! */
		{
			srcParams.BufferFlags = FAPO_BUFFER_VALID;
			break;
		}
	}

	/* Initialize output parameters to something sane */
	dstParams.pBuffer = srcParams.pBuffer;
	dstParams.BufferFlags = FAPO_BUFFER_VALID;
	dstParams.ValidFrameCount = srcParams.ValidFrameCount;

	/* Update parameters, process! */
	for (i = 0; i < voice->effects.count; i += 1)
	{
		fapo = voice->effects.desc[i].pEffect;

		if (!voice->effects.inPlaceProcessing[i])
		{
			if (dstParams.pBuffer == buffer)
			{
				FAudio_INTERNAL_ResizeEffectChainCache(
					voice->audio,
					voice->effects.desc[i].OutputChannels * srcParams.ValidFrameCount
				);
				dstParams.pBuffer = voice->audio->effectChainCache;
			}
			else
			{
				/* FIXME: What if this is smaller because
				 * inputChannels < desc[i].OutputChannels?
				 */
				dstParams.pBuffer = buffer;
			}

			FAudio_zero(
				dstParams.pBuffer,
				voice->effects.desc[i].OutputChannels * srcParams.ValidFrameCount * sizeof(float)
			);
		}

		if (voice->effects.parameterUpdates[i])
		{
			fapo->SetParameters(
				fapo,
				voice->effects.parameters[i],
				voice->effects.parameterSizes[i]
			);
			voice->effects.parameterUpdates[i] = 0;
		}

		fapo->Process(
			fapo,
			1,
			&srcParams,
			1,
			&dstParams,
			voice->effects.desc[i].InitialState
		);

		FAudio_memcpy(&srcParams, &dstParams, sizeof(dstParams));
	}

	*samples = dstParams.ValidFrameCount;

	/* Save the output buffer-flags so the mixer-function can determine when it's save to stop processing the effect chain */
	voice->effects.state = dstParams.BufferFlags;

	LOG_FUNC_EXIT(voice->audio)
	return (float*) dstParams.pBuffer;
}